

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O1

cmBacktraceRange
GetPropertyBacktraces<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *content,vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *backtraces,
          unsigned_long contentEndPosition)

{
  cmBacktraceRange cVar1;
  long local_30;
  pointer local_28;
  pointer local_20;
  
  local_28 = (content->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_20 = local_28 + contentEndPosition;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
            (&local_30,&local_20,&local_28,&cmPropertySentinal_abi_cxx11_);
  cVar1.Begin._M_current =
       (cmListFileBacktrace *)
       ((long)&(((backtraces->
                 super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>).
                 _M_impl.super__Vector_impl_data._M_start)->TopEntry).
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr +
       (local_30 -
        (long)(content->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 1));
  cVar1.End._M_current =
       (backtraces->super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  return cVar1;
}

Assistant:

cmBacktraceRange GetPropertyBacktraces(T const& content, U const& backtraces,
                                       V contentEndPosition)
{
  std::vector<std::string>::const_iterator entryEnd =
    content.begin() + contentEndPosition;

  std::vector<std::string>::const_reverse_iterator rbegin =
    cmMakeReverseIterator(entryEnd);
  rbegin = std::find(rbegin, content.rend(), cmPropertySentinal);

  std::vector<cmListFileBacktrace>::const_iterator it =
    backtraces.begin() + std::distance(content.begin(), rbegin.base());

  std::vector<cmListFileBacktrace>::const_iterator end = backtraces.end();
  return cmMakeRange(it, end);
}